

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O1

Block * __thiscall FMemArena::AddBlock(FMemArena *this,size_t size)

{
  Block *pBVar1;
  Block *pBVar2;
  size_t size_00;
  
  pBVar2 = (Block *)&this->FreeBlocks;
  do {
    pBVar1 = pBVar2;
    pBVar2 = pBVar1->NextBlock;
    if (pBVar2 == (Block *)0x0) {
      size_00 = size + 0x1418;
      if (size + 0x18 < 0x2800) {
        size_00 = 0x2800;
      }
      pBVar2 = (Block *)M_Malloc_Dbg(size_00,
                                     "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/memarena.cpp"
                                     ,0xcb);
      pBVar2->Limit = (void *)((long)&pBVar2->NextBlock + size_00);
      goto LAB_004c7f93;
    }
  } while ((long)pBVar2->Limit - (long)pBVar2 < (long)(size + 0x18));
  pBVar1->NextBlock = pBVar2->NextBlock;
LAB_004c7f93:
  pBVar2->Avail = pBVar2 + 0x18;
  pBVar2->NextBlock = this->TopBlock;
  this->TopBlock = pBVar2;
  return pBVar2;
}

Assistant:

FMemArena::Block *FMemArena::AddBlock(size_t size)
{
	Block *mem, **last;
	size += sizeof(Block);		// Account for header size

	// Search for a free block to use
	for (last = &FreeBlocks, mem = FreeBlocks; mem != NULL; last = &mem->NextBlock, mem = mem->NextBlock)
	{
		if ((BYTE *)mem->Limit - (BYTE *)mem >= (ptrdiff_t)size)
		{
			*last = mem->NextBlock;
			break;
		}
	}
	if (mem == NULL)
	{
		// Allocate a new block
		if (size < BLOCK_SIZE)
		{
			size = BLOCK_SIZE;
		}
		else
		{ // Stick some free space at the end so we can use this block for
		  // other things.
			size += BLOCK_SIZE/2;
		}
		mem = (Block *)M_Malloc(size);
		mem->Limit = (BYTE *)mem + size;
	}
	mem->Reset();
	mem->NextBlock = TopBlock;
	TopBlock = mem;
	return mem;
}